

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5TokendataIterNext(Fts5Iter *pIter,int bFrom,i64 iFrom)

{
  Fts5TokenDataIter *pFVar1;
  Fts5Index *p;
  Fts5Iter *pIter_00;
  long lVar2;
  long lVar3;
  
  pFVar1 = pIter->pTokenDataIter;
  p = pIter->pIndex;
  if (0 < pFVar1->nIter) {
    lVar3 = 0;
    do {
      pIter_00 = pFVar1->apIter[lVar3];
      if ((pIter_00->base).bEof == '\0') {
        lVar2 = (pIter_00->base).iRowid;
        if (lVar2 == (pIter->base).iRowid) {
          fts5MultiIterNext(p,pIter_00,bFrom,iFrom);
          if (bFrom != 0) {
LAB_001dfb13:
            while ((((pIter_00->base).bEof == '\0' && ((pIter_00->base).iRowid < iFrom)) &&
                   (p->rc == 0))) {
              fts5MultiIterNext(p,pIter_00,0,0);
            }
          }
        }
        else if ((bFrom != 0) && (lVar2 < iFrom)) {
          fts5MultiIterNext(p,pIter_00,1,iFrom);
          goto LAB_001dfb13;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pFVar1->nIter);
  }
  if (p->rc == 0) {
    fts5IterSetOutputsTokendata(pIter);
    return;
  }
  return;
}

Assistant:

static void fts5TokendataIterNext(Fts5Iter *pIter, int bFrom, i64 iFrom){
  int ii;
  Fts5TokenDataIter *pT = pIter->pTokenDataIter;
  Fts5Index *pIndex = pIter->pIndex;

  for(ii=0; ii<pT->nIter; ii++){
    Fts5Iter *p = pT->apIter[ii];
    if( p->base.bEof==0
     && (p->base.iRowid==pIter->base.iRowid || (bFrom && p->base.iRowid<iFrom))
    ){
      fts5MultiIterNext(pIndex, p, bFrom, iFrom);
      while( bFrom && p->base.bEof==0
          && p->base.iRowid<iFrom
          && pIndex->rc==SQLITE_OK
      ){
        fts5MultiIterNext(pIndex, p, 0, 0);
      }
    }
  }

  if( pIndex->rc==SQLITE_OK ){
    fts5IterSetOutputsTokendata(pIter);
  }
}